

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,string *error)

{
  XmlFormatting fmt;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [24];
  string *error_local;
  XmlReporter *this_local;
  
  local_28._16_8_ = error;
  error_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"failed",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"message",&local_81);
  XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
            ((ScopedElement *)local_28,&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28._16_8_);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  fmt = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(std::string const &error) {
        m_xml.scopedElement("failed").
            writeAttribute("message", error);
        m_xml.endElement();
    }